

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

bool __thiscall LinkedObjectFile::is_string(LinkedObjectFile *this,int seg,int byte_idx)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  
  if (((byte_idx & 3U) == 0) && (3 < byte_idx)) {
    pvVar2 = std::
             vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
             ::at(&this->words_by_seg,(long)seg);
    if ((ulong)(byte_idx - 4U) <
        (ulong)((((long)(pvVar2->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar2->super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>)._M_impl
                       .super__Vector_impl_data._M_start) / 0x30) * 4)) {
      pvVar2 = std::
               vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               ::at(&this->words_by_seg,(long)seg);
      pvVar3 = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                         (pvVar2,(ulong)(byte_idx - 4U >> 2));
      if (pvVar3->kind == TYPE_PTR) {
        bVar1 = std::operator==(&pvVar3->symbol_name,"string");
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool LinkedObjectFile::is_string(int seg, int byte_idx) {
  if (byte_idx % 4) {
    return false;  // must be aligned pointer.
  }
  int type_tag_ptr = byte_idx - 4;
  // must fit in segment
  if (type_tag_ptr < 0 || size_t(type_tag_ptr) >= words_by_seg.at(seg).size() * 4) {
    return false;
  }
  auto& type_word = words_by_seg.at(seg).at(type_tag_ptr / 4);
  return type_word.kind == LinkedWord::TYPE_PTR && type_word.symbol_name == "string";
}